

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseUserDefinedType(Parser *this,string *type_name)

{
  bool bVar1;
  anon_union_8_1_a8a14541_for_iterator_2 this_00;
  Token *pTVar2;
  ErrorMaker local_c8;
  string_view local_b8;
  undefined4 local_a8;
  ErrorMaker local_98;
  undefined1 local_88 [8];
  string identifier;
  ErrorMaker local_58;
  iterator local_48;
  undefined1 local_38 [8];
  const_iterator iter;
  TypeNameMap *type_names_table;
  string *type_name_local;
  Parser *this_local;
  
  std::__cxx11::string::clear();
  this_00.slot_ = (slot_type *)compiler::anon_unknown_0::GetTypeNameTable();
  iter.inner_.field_1.slot_ = this_00.slot_;
  pTVar2 = io::Tokenizer::current(this->input_);
  _local_38 = (iterator)
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
              ::find<std::__cxx11::string>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
                          *)this_00.slot_,&pTVar2->text);
  local_48 = (iterator)
             absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
             ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
                    *)iter.inner_.field_1.slot_);
  bVar1 = absl::lts_20250127::container_internal::operator!=
                    ((const_iterator *)local_38,(const_iterator *)&local_48);
  if (bVar1) {
    ErrorMaker::ErrorMaker(&local_58,"Expected message type.");
    RecordError(this,local_58);
    pTVar2 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=((string *)type_name,(string *)&pTVar2->text);
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = true;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&identifier.field_2 + 8),
               ".");
    bVar1 = TryConsume(this,stack0xffffffffffffff98);
    if (bVar1) {
      std::__cxx11::string::append((char *)type_name);
    }
    std::__cxx11::string::string((string *)local_88);
    ErrorMaker::ErrorMaker(&local_98,"Expected type name.");
    bVar1 = ConsumeIdentifier(this,(string *)local_88,local_98);
    if (bVar1) {
      std::__cxx11::string::append((string *)type_name);
      while( true ) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,".");
        bVar1 = TryConsume(this,local_b8);
        if (!bVar1) break;
        std::__cxx11::string::append((char *)type_name);
        ErrorMaker::ErrorMaker(&local_c8,"Expected identifier.");
        bVar1 = ConsumeIdentifier(this,(string *)local_88,local_c8);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_005a2145;
        }
        std::__cxx11::string::append((string *)type_name);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
LAB_005a2145:
    local_a8 = 1;
    std::__cxx11::string::~string((string *)local_88);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseUserDefinedType(std::string* type_name) {
  type_name->clear();

  const auto& type_names_table = GetTypeNameTable();
  auto iter = type_names_table.find(input_->current().text);
  if (iter != type_names_table.end()) {
    // Note:  The only place enum types are allowed is for field types, but
    //   if we are parsing a field type then we would not get here because
    //   primitives are allowed there as well.  So this error message doesn't
    //   need to account for enums.
    RecordError("Expected message type.");

    // Pretend to accept this type so that we can go on parsing.
    *type_name = input_->current().text;
    input_->Next();
    return true;
  }

  // A leading "." means the name is fully-qualified.
  if (TryConsume(".")) type_name->append(".");

  // Consume the first part of the name.
  std::string identifier;
  DO(ConsumeIdentifier(&identifier, "Expected type name."));
  type_name->append(identifier);

  // Consume more parts.
  while (TryConsume(".")) {
    type_name->append(".");
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    type_name->append(identifier);
  }

  return true;
}